

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWrite.cpp
# Opt level: O1

void __thiscall stk::FileWrite::closeSndFile(FileWrite *this)

{
  SINT32 bytes;
  uchar local_14 [4];
  
  Stk::swap32(local_14);
  fseek((FILE *)this->fd_,8,0);
  fwrite(local_14,4,1,(FILE *)this->fd_);
  fclose((FILE *)this->fd_);
  return;
}

Assistant:

void FileWrite :: closeSndFile( void )
{
  int bytesPerSample = 1;
  if ( dataType_ == STK_SINT16 )
    bytesPerSample = 2;
  else if ( dataType_ == STK_SINT24 )
    bytesPerSample = 3;
  else if ( dataType_ == STK_SINT32 )
    bytesPerSample = 4;
  else if ( dataType_ == STK_FLOAT32 )
    bytesPerSample = 4;
  else if ( dataType_ == STK_FLOAT64 )
    bytesPerSample = 8;

  SINT32 bytes = (SINT32) (frameCounter_ * bytesPerSample * channels_);
#ifdef __LITTLE_ENDIAN__
  swap32 ((unsigned char *)&bytes);
#endif
  fseek(fd_, 8, SEEK_SET); // jump to data size
  fwrite(&bytes, 4, 1, fd_);
  fclose(fd_);
}